

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cc
# Opt level: O0

int x509_digest_verify_init(EVP_MD_CTX *ctx,X509_ALGOR *sigalg,EVP_PKEY *pkey)

{
  int iVar1;
  EVP_MD *type;
  EVP_MD *digest;
  int local_30;
  int pkey_nid;
  int digest_nid;
  int sigalg_nid;
  EVP_PKEY *pkey_local;
  X509_ALGOR *sigalg_local;
  EVP_MD_CTX *ctx_local;
  
  _digest_nid = (EVP_PKEY *)pkey;
  pkey_local = (EVP_PKEY *)sigalg;
  sigalg_local = (X509_ALGOR *)ctx;
  pkey_nid = OBJ_obj2nid((ASN1_OBJECT *)sigalg->algorithm);
  iVar1 = OBJ_find_sigid_algs(pkey_nid,&local_30,(int *)((long)&digest + 4));
  if (iVar1 == 0) {
    ERR_put_error(0xc,0,0xb8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/algorithm.cc"
                  ,0x56);
    ctx_local._4_4_ = 0;
  }
  else {
    iVar1 = EVP_PKEY_id(_digest_nid);
    if (digest._4_4_ == iVar1) {
      iVar1 = x509_digest_nid_ok(local_30);
      if (iVar1 == 0) {
        ERR_put_error(0xc,0,0x6f,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/algorithm.cc"
                      ,0x62);
        ctx_local._4_4_ = 0;
      }
      else if (local_30 == 0) {
        if (pkey_nid == 0x390) {
          ctx_local._4_4_ =
               x509_rsa_pss_to_ctx((EVP_MD_CTX *)sigalg_local,(X509_ALGOR *)pkey_local,
                                   (EVP_PKEY *)_digest_nid);
        }
        else if (pkey_nid == 0x3b5) {
          if (pkey_local->pkey == (void *)0x0) {
            ctx_local._4_4_ =
                 EVP_DigestVerifyInit
                           ((EVP_MD_CTX *)sigalg_local,(EVP_PKEY_CTX **)0x0,(EVP_MD *)0x0,
                            (ENGINE *)0x0,_digest_nid);
          }
          else {
            ERR_put_error(0xb,0,0x88,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/algorithm.cc"
                          ,0x6d);
            ctx_local._4_4_ = 0;
          }
        }
        else {
          ERR_put_error(0xc,0,0xb8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/algorithm.cc"
                        ,0x72);
          ctx_local._4_4_ = 0;
        }
      }
      else if ((pkey_local->pkey == (void *)0x0) || (*pkey_local->pkey == 5)) {
        type = (EVP_MD *)EVP_get_digestbynid(local_30);
        if (type == (EVP_MD *)0x0) {
          ERR_put_error(0xc,0,0xb7,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/algorithm.cc"
                        ,0x83);
          ctx_local._4_4_ = 0;
        }
        else {
          ctx_local._4_4_ =
               EVP_DigestVerifyInit
                         ((EVP_MD_CTX *)sigalg_local,(EVP_PKEY_CTX **)0x0,type,(ENGINE *)0x0,
                          _digest_nid);
        }
      }
      else {
        ERR_put_error(0xb,0,0x88,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/algorithm.cc"
                      ,0x7c);
        ctx_local._4_4_ = 0;
      }
    }
    else {
      ERR_put_error(0xc,0,0xbd,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/algorithm.cc"
                    ,0x5c);
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int x509_digest_verify_init(EVP_MD_CTX *ctx, const X509_ALGOR *sigalg,
                            EVP_PKEY *pkey) {
  // Convert the signature OID into digest and public key OIDs.
  int sigalg_nid = OBJ_obj2nid(sigalg->algorithm);
  int digest_nid, pkey_nid;
  if (!OBJ_find_sigid_algs(sigalg_nid, &digest_nid, &pkey_nid)) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_UNKNOWN_SIGNATURE_ALGORITHM);
    return 0;
  }

  // Check the public key OID matches the public key type.
  if (pkey_nid != EVP_PKEY_id(pkey)) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_WRONG_PUBLIC_KEY_TYPE);
    return 0;
  }

  // Check for permitted digest algorithms
  if (!x509_digest_nid_ok(digest_nid)) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_DIGEST_AND_KEY_TYPE_NOT_SUPPORTED);
    return 0;
  }

  // NID_undef signals that there are custom parameters to set.
  if (digest_nid == NID_undef) {
    if (sigalg_nid == NID_rsassaPss) {
      return x509_rsa_pss_to_ctx(ctx, sigalg, pkey);
    }
    if (sigalg_nid == NID_ED25519) {
      if (sigalg->parameter != NULL) {
        OPENSSL_PUT_ERROR(X509, X509_R_INVALID_PARAMETER);
        return 0;
      }
      return EVP_DigestVerifyInit(ctx, NULL, NULL, NULL, pkey);
    }
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_UNKNOWN_SIGNATURE_ALGORITHM);
    return 0;
  }

  // The parameter should be an explicit NULL for RSA and omitted for ECDSA. For
  // compatibility, we allow either for both algorithms. See b/167375496.
  //
  // TODO(davidben): Chromium's verifier allows both forms for RSA, but enforces
  // ECDSA more strictly. Align with Chromium and add a flag for b/167375496.
  if (sigalg->parameter != NULL && sigalg->parameter->type != V_ASN1_NULL) {
    OPENSSL_PUT_ERROR(X509, X509_R_INVALID_PARAMETER);
    return 0;
  }

  // Otherwise, initialize with the digest from the OID.
  const EVP_MD *digest = EVP_get_digestbynid(digest_nid);
  if (digest == NULL) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_UNKNOWN_MESSAGE_DIGEST_ALGORITHM);
    return 0;
  }

  return EVP_DigestVerifyInit(ctx, NULL, digest, NULL, pkey);
}